

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetBXSingleStray(ndicapi *pol,int portHandle,float *outCoord)

{
  byte bVar1;
  ulong uVar2;
  
  bVar1 = pol->BxHandleCount;
  if (bVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    while (pol->BxHandles[uVar2] != portHandle) {
      uVar2 = uVar2 + 1;
      if ((uint)bVar1 == uVar2) {
        return 1;
      }
    }
  }
  if ((uint)uVar2 == (uint)bVar1) {
    return 1;
  }
  outCoord[2] = pol->BxActiveSingleStrayMarkerPosition[uVar2 & 0xffffffff][2];
  *(undefined8 *)outCoord =
       *(undefined8 *)pol->BxActiveSingleStrayMarkerPosition[uVar2 & 0xffffffff];
  return 0;
}

Assistant:

ndicapiExport int ndiGetBXSingleStray(ndicapi* pol, int portHandle, float outCoord[3])
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  memcpy(outCoord, pol->BxActiveSingleStrayMarkerPosition[i], sizeof(float) * 3);
  return NDI_OKAY;
}